

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnPredictForFile(XL *out,char *model_path,char *out_path)

{
  Solver *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HyperParam *hyper_param;
  ostream *poVar2;
  float fVar3;
  Modifier green;
  Modifier reset;
  Modifier bold;
  Timer timer;
  Modifier local_54;
  Modifier local_50;
  Modifier local_4c;
  string local_48;
  Timer local_28;
  
  Timer::Timer(&local_28);
  Timer::tic(&local_28);
  hyper_param = (HyperParam *)*out;
  std::__cxx11::string::string((string *)&local_48,model_path,(allocator *)&local_54);
  std::__cxx11::string::operator=((string *)&hyper_param->model_file,(string *)&local_48);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_48,out_path,(allocator *)&local_54);
  std::__cxx11::string::operator=((string *)&hyper_param->output_file,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  hyper_param->res_out = true;
  hyper_param->is_train = false;
  this = (Solver *)(hyper_param + 1);
  xLearn::Solver::Initialize(this,hyper_param);
  (this->hyper_param_).is_train = false;
  xLearn::Solver::StartWork(this);
  xLearn::Solver::Clear(this);
  fVar3 = Timer::toc(&local_28);
  StringPrintf_abi_cxx11_(&local_48,"Total time cost: %.2f (sec)",(double)fVar3);
  local_54.code = FG_GREEN;
  local_4c.code = BOLD;
  local_50.code = RESET;
  poVar2 = Color::operator<<((ostream *)&std::cout,&local_54);
  poVar2 = Color::operator<<(poVar2,&local_4c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[------------] ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
  poVar2 = Color::operator<<(poVar2,&local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

XL_DLL int XLearnPredictForFile(XL *out, const char *model_path, 
                         const char *out_path) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().model_file = std::string(model_path);
  xl->GetHyperParam().output_file = std::string(out_path);
  xl->GetHyperParam().res_out = true;
  xl->GetHyperParam().is_train = false;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().SetPredict();
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}